

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O0

long __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::value
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,label_key_type labels_value)

{
  bool bVar1;
  element_type *peVar2;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  in_RDI;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
  ptr;
  memory_order __b;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *in_stack_ffffffffffffff98;
  atomic<long> *paVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  __int_type local_20;
  
  std::
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
  span<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
            ((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::find
            ((dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  bVar1 = std::operator==((shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
                           *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          in_stack_ffffffffffffff98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_20 = 0;
  }
  else {
    peVar2 = std::
             __shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x22615e);
    paVar3 = &peVar2->value;
    std::operator&(relaxed,__memory_order_mask);
    local_20 = (paVar3->super___atomic_base<long>)._M_i;
  }
  std::
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair>
  ::~shared_ptr((shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
                 *)0x2261fd);
  return local_20;
}

Assistant:

value_type value(label_key_type labels_value) {
    if (auto ptr = Base::find(labels_value); ptr != nullptr) {
      return ptr->value.load(std::memory_order::relaxed);
    }
    else {
      return value_type{};
    }
  }